

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

void Abc_NtkMarkCriticalNodes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj = Abc_NtkObj(pNtk,local_1c);
    if (((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) &&
       (iVar1 = Abc_ObjRequiredLevel(pObj), (int)(iVar1 - (*(uint *)&pObj->field_0x14 >> 0xc)) < 2))
    {
      *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef | 0x10;
      local_20 = local_20 + 1;
    }
  }
  iVar1 = Abc_NtkNodeNum(pNtk);
  printf("The number of nodes on the critical paths = %6d  (%5.2f %%)\n",
         ((double)(int)local_20 * 100.0) / (double)iVar1,(ulong)local_20);
  return;
}

Assistant:

void Abc_NtkMarkCriticalNodes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( Abc_ObjRequiredLevel(pNode) - pNode->Level <= 1 )
            pNode->fMarkA = 1, Counter++;
    printf( "The number of nodes on the critical paths = %6d  (%5.2f %%)\n", Counter, 100.0 * Counter / Abc_NtkNodeNum(pNtk) );
}